

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O3

cmDocumentationEntry * cmGlobalNinjaGenerator::GetDocumentation(void)

{
  cmDocumentationEntry *in_RDI;
  
  (in_RDI->Name)._M_dataplus._M_p = (pointer)&(in_RDI->Name).field_2;
  *(undefined4 *)&(in_RDI->Name).field_2 = 0x6a6e694e;
  *(undefined2 *)((long)&(in_RDI->Name).field_2 + 4) = 0x61;
  (in_RDI->Name)._M_string_length = 5;
  (in_RDI->Brief)._M_dataplus._M_p = (pointer)&(in_RDI->Brief).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&in_RDI->Brief,"Generates build.ninja files.","");
  in_RDI->CustomNamePrefix = ' ';
  return in_RDI;
}

Assistant:

cmDocumentationEntry cmGlobalNinjaGenerator::GetDocumentation()
{
  return { cmGlobalNinjaGenerator::GetActualName(),
           "Generates build.ninja files." };
}